

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TiledInputFile::Data::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ifd,TileProcessGroup *tileg,
          FrameBuffer *outfb,exr_chunk_info_t *cinfo)

{
  Process *pPVar1;
  Data *in_RCX;
  Data *in_RDX;
  TaskGroup *in_RDI;
  Data *in_R8;
  void *in_R9;
  Task *in_stack_ffffffffffffffb0;
  TaskGroup *pTVar2;
  ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true> *in_stack_ffffffffffffffc0;
  
  IlmThread_3_3::Task::Task(in_stack_ffffffffffffffb0,in_RDI);
  in_RDI->_data = (Data *)&PTR__TileBufferTask_004a5bd0;
  in_RDI[2]._data = in_R8;
  in_RDI[3]._data = in_RDX;
  pTVar2 = in_RDI + 4;
  pPVar1 = IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::TileProcess,_true>::pop
                     (in_stack_ffffffffffffffc0);
  pTVar2->_data = (Data *)pPVar1;
  in_RDI[5]._data = in_RCX;
  memcpy(&(in_RDI[4]._data)->isEmpty,in_R9,0x40);
  return;
}

Assistant:

TileBufferTask (
            ILMTHREAD_NAMESPACE::TaskGroup* group,
            Data*                   ifd,
            TileProcessGroup*       tileg,
            const FrameBuffer*      outfb,
            const exr_chunk_info_t& cinfo)
            : Task (group)
            , _outfb (outfb)
            , _ifd (ifd)
            , _tile (tileg->pop ())
            , _tile_group (tileg)
        {
            _tile->cinfo = cinfo;
        }